

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_gc_check(ASMState *as)

{
  undefined4 uVar1;
  MCode *pMVar2;
  Reg RVar3;
  uint rr;
  IRRef args [2];
  
  ra_evictset(as,0xffff0fc7);
  uVar1 = *(undefined4 *)&as->mcp;
  asm_guardcc(as,5);
  pMVar2 = as->mcp;
  pMVar2[-2] = 0x85;
  pMVar2[-1] = 0xc0;
  as->mcp = pMVar2 + -2;
  args[0] = 0x7ffd;
  args[1] = 0x7ffe;
  asm_gencall(as,lj_ir_callinfo + 0x28,args);
  RVar3 = ra_releasetmp(as,0x7ffd);
  rr = RVar3 | 0x80200;
  emit_rmro(as,XO_LEA,rr,0xe,-0xf80);
  RVar3 = ra_releasetmp(as,0x7ffe);
  emit_loadi(as,RVar3,as->gcsteps);
  pMVar2 = as->mcp;
  pMVar2[-1] = (char)uVar1 - (char)pMVar2;
  pMVar2[-2] = 'r';
  as->mcp = pMVar2 + -2;
  emit_rma(as,XO_CMP,rr,&as->J[-1].penalty[0x24].val);
  emit_rma(as,XO_MOV,rr,as->J[-1].penalty + 0x24);
  as->gcsteps = 0;
  if (as->mclim <= as->mcp) {
    return;
  }
  asm_mclimit(as);
}

Assistant:

static void asm_gc_check(ASMState *as)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_gc_step_jit];
  IRRef args[2];
  MCLabel l_end;
  Reg tmp;
  ra_evictset(as, RSET_SCRATCH);
  l_end = emit_label(as);
  /* Exit trace if in GCSatomic or GCSfinalize. Avoids syncing GC objects. */
  asm_guardcc(as, CC_NE);  /* Assumes asm_snap_prep() already done. */
  emit_rr(as, XO_TEST, RID_RET, RID_RET);
  args[0] = ASMREF_TMP1;  /* global_State *g */
  args[1] = ASMREF_TMP2;  /* MSize steps     */
  asm_gencall(as, ci, args);
  tmp = ra_releasetmp(as, ASMREF_TMP1);
#if LJ_GC64
  emit_rmro(as, XO_LEA, tmp|REX_64, RID_DISPATCH, GG_DISP2G);
#else
  emit_loada(as, tmp, J2G(as->J));
#endif
  emit_loadi(as, ra_releasetmp(as, ASMREF_TMP2), as->gcsteps);
  /* Jump around GC step if GC total < GC threshold. */
  emit_sjcc(as, CC_B, l_end);
  emit_opgl(as, XO_ARITH(XOg_CMP), tmp|REX_GC64, gc.threshold);
  emit_getgl(as, tmp, gc.total);
  as->gcsteps = 0;
  checkmclim(as);
}